

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

int count_sgrproj_bits(SgrprojInfo *sgrproj_info,SgrprojInfo *ref_sgrproj_info)

{
  int iVar1;
  int iVar2;
  
  iVar2 = sgrproj_info->ep;
  if (av1_sgr_params[iVar2].r[0] < 1) {
    iVar1 = 4;
  }
  else {
    iVar1 = aom_count_primitive_refsubexpfin
                      (0x80,4,(short)ref_sgrproj_info->xqd[0] + 0x60,
                       (short)sgrproj_info->xqd[0] + 0x60);
    iVar1 = iVar1 + 4;
  }
  if (0 < av1_sgr_params[iVar2].r[1]) {
    iVar2 = aom_count_primitive_refsubexpfin
                      (0x80,4,(short)ref_sgrproj_info->xqd[1] + 0x20,
                       (short)sgrproj_info->xqd[1] + 0x20);
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

static int count_sgrproj_bits(SgrprojInfo *sgrproj_info,
                              SgrprojInfo *ref_sgrproj_info) {
  int bits = SGRPROJ_PARAMS_BITS;
  const sgr_params_type *params = &av1_sgr_params[sgrproj_info->ep];
  if (params->r[0] > 0)
    bits += aom_count_primitive_refsubexpfin(
        SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0,
        sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0);
  if (params->r[1] > 0)
    bits += aom_count_primitive_refsubexpfin(
        SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1,
        sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1);
  return bits;
}